

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.cpp
# Opt level: O3

void __thiscall
cfd::js::api::json::GetExtkeyInfoResponse::ConvertFromStruct
          (GetExtkeyInfoResponse *this,GetExtkeyInfoResponseStruct *data)

{
  std::__cxx11::string::_M_assign((string *)&this->network_);
  std::__cxx11::string::_M_assign((string *)&this->version_);
  this->depth_ = data->depth;
  std::__cxx11::string::_M_assign((string *)&this->fingerprint_);
  this->child_number_ = data->child_number;
  std::__cxx11::string::_M_assign((string *)&this->chain_code_);
  std::__cxx11::string::_M_assign((string *)&this->key_type_);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(this->ignore_items)._M_t,&(data->ignore_items)._M_t);
  return;
}

Assistant:

void GetExtkeyInfoResponse::ConvertFromStruct(
    const GetExtkeyInfoResponseStruct& data) {
  network_ = data.network;
  version_ = data.version;
  depth_ = data.depth;
  fingerprint_ = data.fingerprint;
  child_number_ = data.child_number;
  chain_code_ = data.chain_code;
  key_type_ = data.key_type;
  ignore_items = data.ignore_items;
}